

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

void __thiscall
xemmai::t_type_of<xemmai::t_type_of<xemmai::t_object>>::t_type_of<2ul>
          (t_type_of<xemmai::t_type_of<xemmai::t_object>> *this,array<const_void_*,_2UL> *a_ids,
          t_type *a_super)

{
  int local_6c;
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  local_68;
  unsigned_long local_50;
  void *local_48;
  t_type *a_super_local;
  _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  local_38;
  
  local_48 = (void *)0x0;
  local_50 = 0x178;
  local_6c = 0;
  local_68.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_38._M_impl.super__Rb_tree_header._M_header;
  local_38._M_impl._0_8_ = 0;
  local_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_38._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  a_super_local = a_super;
  local_38._M_impl.super__Rb_tree_header._M_header._M_right =
       local_38._M_impl.super__Rb_tree_header._M_header._M_left;
  t_derives<xemmai::t_type_of<xemmai::t_object>,xemmai::t_type_of<xemmai::t_object>>::
  t_derives<std::array<void_const*,2ul>const&,xemmai::t_type_of<xemmai::t_object>*&,decltype(nullptr),unsigned_long,int,std::vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>,std::map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>>
            ((t_derives<xemmai::t_type_of<xemmai::t_object>,xemmai::t_type_of<xemmai::t_object>> *)
             this,a_ids,&a_super_local,&local_48,&local_50,&local_6c,&local_68,
             (map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
              *)&local_38);
  std::
  _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  ::~_Rb_tree(&local_38);
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector(&local_68);
  *(code **)(this + 0x68) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_do_scan;
  *(code **)(this + 0x90) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_do_get;
  *(undefined8 *)(this + 0x98) = 0;
  *(code **)(this + 200) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported0;
  *(code **)(this + 0xc0) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported0;
  *(code **)(this + 0x170) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x168) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x160) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x158) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x150) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x148) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x140) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x138) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x130) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x128) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x120) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x118) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x108) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x100) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0xf8) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0xf0) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0xe8) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0xe0) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0xd8) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0xd0) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  return;
}

Assistant:

t_type_of(const std::array<t_type_id, A_n>& a_ids, t_type* a_super) : t_base(a_ids, a_super, nullptr, sizeof(t_type), 0, std::vector<std::pair<t_root, t_rvalue>>{}, std::map<t_object*, size_t>{})
	{
		f_finalize = f_do_scan;
		v_get = static_cast<t_pvalue (t_type::*)(t_object*, t_object*, size_t&)>(&t_type_of::f_do_get);
		f_string = f_hash = f_not_supported0;
		f_get_at = f_set_at = f_plus = f_minus = f_complement = f_multiply = f_divide = f_modulus = f_subtract = f_left_shift = f_right_shift = f_less = f_less_equal = f_greater = f_greater_equal = f_equals = f_not_equals = f_and = f_xor = f_or = f_not_supported1;
	}